

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_522a9::TestValidCheckSucceeds::RunImpl(TestValidCheckSucceeds *this)

{
  return;
}

Assistant:

TEST(ValidCheckSucceeds)
{
    bool const b = true;
    CHECK(b);
}